

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O1

Value * duckdb::Vector::GetValue(Value *__return_storage_ptr__,Vector *v_p,idx_t index_p)

{
  bool bVar1;
  
  GetValueInternal(__return_storage_ptr__,v_p,index_p);
  bVar1 = LogicalType::HasAlias(&v_p->type);
  if (bVar1) {
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              (&(__return_storage_ptr__->type_).type_info_,&(v_p->type).type_info_);
  }
  return __return_storage_ptr__;
}

Assistant:

Value Vector::GetValue(const Vector &v_p, idx_t index_p) {
	auto value = GetValueInternal(v_p, index_p);
	// set the alias of the type to the correct value, if there is a type alias
	if (v_p.GetType().HasAlias()) {
		value.GetTypeMutable().CopyAuxInfo(v_p.GetType());
	}
	if (v_p.GetType().id() != LogicalTypeId::AGGREGATE_STATE && value.type().id() != LogicalTypeId::AGGREGATE_STATE) {

		D_ASSERT(v_p.GetType() == value.type());
	}
	return value;
}